

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

_Bool btorsim_bv_is_umulo(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *__ptr_01;
  BtorSimBitVector *bv;
  BtorSimBitVector *in_RSI;
  BtorSimBitVector *in_RDI;
  BtorSimBitVector *o;
  BtorSimBitVector *mul;
  BtorSimBitVector *bext;
  BtorSimBitVector *aext;
  _Bool res;
  undefined8 in_stack_ffffffffffffffc8;
  uint32_t len;
  BtorSimBitVector *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffe8;
  uint3 in_stack_ffffffffffffffec;
  uint upper;
  
  len = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  upper = (uint)in_stack_ffffffffffffffec;
  if (1 < in_RDI->width) {
    __ptr = btorsim_bv_uext(in_stack_ffffffffffffffd0,len);
    __ptr_00 = btorsim_bv_uext(in_stack_ffffffffffffffd0,len);
    __ptr_01 = btorsim_bv_mul(o,in_RDI);
    bv = btorsim_bv_slice(in_RSI,upper,in_stack_ffffffffffffffe8);
    _Var1 = btorsim_bv_is_zero(bv);
    if (!_Var1) {
      upper = 0x1000000;
    }
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(bv);
  }
  return (_Bool)((byte)(upper >> 0x18) & 1);
}

Assistant:

bool
btorsim_bv_is_umulo (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  bool res;
  BtorSimBitVector *aext, *bext, *mul, *o;

  res = false;

  if (a->width > 1)
  {
    aext = btorsim_bv_uext (a, a->width);
    bext = btorsim_bv_uext (b, b->width);
    mul  = btorsim_bv_mul (aext, bext);
    o    = btorsim_bv_slice (mul, mul->width - 1, a->width);
    if (!btorsim_bv_is_zero (o)) res = true;
    free (aext);
    free (bext);
    free (mul);
    free (o);
  }

  return res;
}